

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch_descriptorset_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::SwitchDescriptorSetPass::Process(SwitchDescriptorSetPass *this)

{
  IRContext *this_00;
  Module *pMVar1;
  DecorationManager *this_01;
  Instruction *pIVar2;
  pointer pOVar3;
  bool bVar4;
  pointer ppIVar5;
  pointer ppIVar6;
  uint32_t uVar7;
  Instruction *pIVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  Status SVar12;
  Instruction *this_02;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> decos;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(this_00);
  }
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_02 = *(Instruction **)
             ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  pIVar8 = (Instruction *)
           ((long)&(pMVar1->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  if (this_02 == pIVar8) {
    SVar12 = SuccessWithoutChange;
  }
  else {
    this_01 = (this_00->decoration_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
              _M_head_impl;
    SVar12 = SuccessWithoutChange;
    do {
      if (this_02->opcode_ == OpVariable) {
        uVar7 = 0;
        if (this_02->has_result_id_ == true) {
          uVar7 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
        }
        analysis::DecorationManager::GetDecorationsFor(&local_48,this_01,uVar7,false);
        ppIVar6 = local_48.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppIVar5 = local_48.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (ppIVar5 == ppIVar6) break;
          pIVar2 = *ppIVar5;
          uVar11 = (pIVar2->has_result_id_ & 1) + 1;
          if (pIVar2->has_type_id_ == false) {
            uVar11 = (uint)pIVar2->has_result_id_;
          }
          uVar7 = Instruction::GetSingleWordOperand(pIVar2,uVar11 + 1);
          if (uVar7 == 0x22) {
            pIVar2 = *ppIVar5;
            uVar11 = (pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar11 = (uint)pIVar2->has_result_id_;
            }
            uVar7 = Instruction::GetSingleWordOperand(pIVar2,uVar11 + 2);
            if (uVar7 != *(uint32_t *)&(this->super_Pass).field_0x34) goto LAB_005098f2;
            pIVar2 = *ppIVar5;
            local_70._16_4_ = this->ds_to_;
            local_70._0_8_ = &PTR__SmallVector_00b15d78;
            local_70._24_8_ = local_70 + 0x10;
            local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_70._8_8_ = 1;
            uVar9 = (ulong)(pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar9 = (ulong)pIVar2->has_result_id_;
            }
            uVar9 = uVar9 + 2;
            pOVar3 = (pIVar2->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar10 = ((long)(pIVar2->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                     -0x5555555555555555;
            if (uVar10 < uVar9 || uVar10 - uVar9 == 0) {
              __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2b8,
                            "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                           );
            }
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)
                       ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                       (ulong)(uint)((int)uVar9 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_70)
            ;
            local_70._0_8_ = &PTR__SmallVector_00b15d78;
            if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_50,local_50._M_head_impl);
            }
            SVar12 = SuccessWithChange;
            bVar4 = true;
          }
          else {
LAB_005098f2:
            bVar4 = false;
          }
          ppIVar5 = ppIVar5 + 1;
        } while (!bVar4);
        if (local_48.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      this_02 = (this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_02 != pIVar8);
  }
  return SVar12;
}

Assistant:

Pass::Status SwitchDescriptorSetPass::Process() {
  Status status = Status::SuccessWithoutChange;
  auto* deco_mgr = context()->get_decoration_mgr();

  for (Instruction& var : context()->types_values()) {
    if (var.opcode() != spv::Op::OpVariable) {
      continue;
    }
    auto decos = deco_mgr->GetDecorationsFor(var.result_id(), false);
    for (const auto& deco : decos) {
      spv::Decoration d = spv::Decoration(deco->GetSingleWordInOperand(1u));
      if (d == spv::Decoration::DescriptorSet &&
          deco->GetSingleWordInOperand(2u) == ds_from_) {
        deco->SetInOperand(2u, {ds_to_});
        status = Status::SuccessWithChange;
        break;
      }
    }
  }
  return status;
}